

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AnalysisScopeVisitor.h
# Opt level: O0

void __thiscall
slang::analysis::AnalysisScopeVisitor::visit(AnalysisScopeVisitor *this,ClassType *symbol)

{
  vector<slang::analysis::PendingAnalysis,_std::allocator<slang::analysis::PendingAnalysis>_>
  *in_RSI;
  long in_RDI;
  PendingAnalysis PVar1;
  AnalysisManager *in_stack_ffffffffffffffe0;
  
  PVar1 = AnalysisManager::analyzeSymbol
                    (in_stack_ffffffffffffffe0,(Symbol *)(*(long *)(in_RDI + 0x10) + 8));
  std::vector<slang::analysis::PendingAnalysis,_std::allocator<slang::analysis::PendingAnalysis>_>::
  emplace_back<slang::analysis::PendingAnalysis>
            (in_RSI,(PendingAnalysis *)PVar1.analysisManager.ptr.ptr);
  return;
}

Assistant:

void visit(const ClassType& symbol) {
        result.childScopes.emplace_back(manager.analyzeSymbol(symbol));
    }